

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_font * nk_font_atlas_add_compressed_base85
                    (nk_font_atlas *atlas,char *data_base85,float height,nk_font_config *config)

{
  nk_plugin_alloc p_Var1;
  int *compressed_data;
  int *piVar2;
  nk_font *pnVar3;
  char cVar4;
  long lVar5;
  nk_size compressed_size;
  char *pcVar6;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3511,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  p_Var1 = (atlas->temporary).alloc;
  if (p_Var1 == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3512,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3513,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).alloc != (nk_plugin_alloc)0x0) {
    if ((atlas->permanent).free == (nk_plugin_free)0x0) {
      __assert_fail("atlas->permanent.free",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x3515,
                    "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                   );
    }
    if (data_base85 != (char *)0x0) {
      if (*data_base85 == '\0') {
        compressed_size = 0;
      }
      else {
        lVar5 = 1;
        do {
          pcVar6 = data_base85 + lVar5;
          lVar5 = lVar5 + 1;
        } while (*pcVar6 != '\0');
        compressed_size =
             (nk_size)((uint)((ulong)((int)lVar5 + 3) * 0xcccccccd >> 0x20) & 0xfffffffc);
      }
      compressed_data = (int *)(*p_Var1)((atlas->temporary).userdata,(void *)0x0,compressed_size);
      if (compressed_data != (int *)0x0) {
        cVar4 = *data_base85;
        if (cVar4 != '\0') {
          pcVar6 = data_base85 + 5;
          piVar2 = compressed_data;
          do {
            *piVar2 = (((((0x5b < pcVar6[-1] ^ 0xffffffdd) + (int)pcVar6[-1]) * 0x55 +
                        (0x5b < pcVar6[-2] ^ 0xffffffdd) + (int)pcVar6[-2]) * 0x55 +
                       (0x5b < pcVar6[-3] ^ 0xffffffdd) + (int)pcVar6[-3]) * 0x55 +
                      (0x5b < pcVar6[-4] ^ 0xffffffdd) + (int)pcVar6[-4]) * 0x55 +
                      ('[' < cVar4 ^ 0xffffffdd) + (int)cVar4;
            piVar2 = piVar2 + 1;
            cVar4 = *pcVar6;
            pcVar6 = pcVar6 + 5;
          } while (cVar4 != '\0');
        }
        pnVar3 = nk_font_atlas_add_compressed(atlas,compressed_data,compressed_size,height,config);
        (*(atlas->temporary).free)((atlas->temporary).userdata,compressed_data);
        return pnVar3;
      }
      __assert_fail("compressed_data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x351e,
                    "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                   );
    }
    __assert_fail("data_base85",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x3517,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  __assert_fail("atlas->permanent.alloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x3514,
                "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
               );
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed_base85(struct nk_font_atlas *atlas,
    const char *data_base85, float height, const struct nk_font_config *config)
{
    int compressed_size;
    void *compressed_data;
    struct nk_font *font;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(data_base85);
    if (!atlas || !data_base85 || !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    compressed_size = (((int)nk_strlen(data_base85) + 4) / 5) * 4;
    compressed_data = atlas->temporary.alloc(atlas->temporary.userdata,0, (nk_size)compressed_size);
    NK_ASSERT(compressed_data);
    if (!compressed_data) return 0;
    nk_decode_85((unsigned char*)compressed_data, (const unsigned char*)data_base85);
    font = nk_font_atlas_add_compressed(atlas, compressed_data,
                    (nk_size)compressed_size, height, config);
    atlas->temporary.free(atlas->temporary.userdata, compressed_data);
    return font;
}